

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFileParser.cpp
# Opt level: O0

void __thiscall LabelFileParser::readLabelFile(LabelFileParser *this)

{
  bool bVar1;
  ulong uVar2;
  istream *piVar3;
  int local_1f0;
  int j;
  istringstream stream;
  string local_68 [8];
  string token;
  int local_34;
  string local_30 [4];
  int i;
  string str;
  LabelFileParser *this_local;
  
  uVar2 = std::ios::operator!((ios *)(&this->_inputText + *(long *)(*(long *)this + -0x18)));
  if ((uVar2 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Can\'t open labelfile");
    exit(1);
  }
  std::__cxx11::string::string(local_30);
  local_34 = 0;
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,local_30);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      std::__cxx11::string::~string(local_30);
      return;
    }
    std::__cxx11::string::string(local_68);
    std::__cxx11::istringstream::istringstream((istringstream *)&j,local_30,_S_in);
    if (local_34 != 0) {
      local_1f0 = 0;
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&j,local_68,',');
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
        if (!bVar1) break;
        if (local_1f0 != 0) {
          if (1 < local_1f0) {
            std::operator<<((ostream *)&std::cout,"Label file must be one dimension.");
            exit(1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->_label,(value_type *)local_68);
        }
        local_1f0 = local_1f0 + 1;
      }
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&j);
    std::__cxx11::string::~string(local_68);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void LabelFileParser::readLabelFile(){//{{{
    if(!_inputText){
        cout<<"Can't open labelfile";
        exit(1);
    }
    string str;
    for(int i=0;getline(_inputText,str);i++){
        string token;
        istringstream stream(str);
        if(i == 0) continue;
        for(int j=0; getline(stream,token,','); j++){
            if(j == 0)continue;
            if(j > 1){
                cout<<"Label file must be one dimension.";
                exit(1);
            }
            _label.push_back(token);
        }
    }
}